

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidget *treeview,QTreeWidgetItem *after,int type)

{
  long lVar1;
  QTreeWidgetItem **ppQVar2;
  QTreeWidgetItem *this_00;
  QTreeWidgetItemPrivate *pQVar3;
  QTreeModel *pQVar4;
  long lVar5;
  long lVar6;
  int index;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00810850;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  pQVar3 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar3->q = this;
  (pQVar3->display).d.d = (Data *)0x0;
  (pQVar3->display).d.ptr = (QVariant *)0x0;
  *(undefined8 *)((long)&(pQVar3->display).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(pQVar3->display).d.size + 1) = 0;
  pQVar3->rowGuess = -1;
  pQVar3->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar3;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  pQVar4 = treeModel(this,treeview);
  if (pQVar4 == (QTreeModel *)0x0) {
    return;
  }
  this_00 = pQVar4->rootItem;
  lVar5 = (this_00->children).d.size;
  if (lVar5 == 0) {
    index = 0;
  }
  else {
    lVar5 = lVar5 << 3;
    index = 0;
    lVar6 = 0;
    do {
      if (lVar5 == 0) goto LAB_005afdb5;
      lVar1 = lVar6 + 1;
      lVar5 = lVar5 + -8;
      ppQVar2 = (this_00->children).d.ptr + lVar6;
      lVar6 = lVar1;
    } while (*ppQVar2 != after);
    index = (int)lVar1;
  }
LAB_005afdb5:
  insertChild(this_00,index,this);
  QList<QList<QWidgetItemData>_>::reserve
            (&this->values,(long)(int)(pQVar4->headerItem->values).d.size);
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, QTreeWidgetItem *after, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        int i = model->rootItem->children.indexOf(after) + 1;
        model->rootItem->insertChild(i, this);
        values.reserve(model->headerItem->columnCount());
    }
}